

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHParameters.cpp
# Opt level: O0

bool __thiscall DHParameters::deserialise(DHParameters *this,ByteString *serialised)

{
  size_t sVar1;
  unsigned_long inBitLen;
  DHParameters *in_RDI;
  ByteString dLen;
  ByteString dG;
  ByteString dP;
  ByteString *in_stack_ffffffffffffff28;
  DHParameters *in_stack_ffffffffffffff30;
  ByteString *in_stack_ffffffffffffff48;
  undefined1 local_1;
  
  ByteString::chainDeserialise(in_stack_ffffffffffffff48);
  ByteString::chainDeserialise(in_stack_ffffffffffffff48);
  ByteString::chainDeserialise(in_stack_ffffffffffffff48);
  sVar1 = ByteString::size((ByteString *)0x14d85e);
  if (sVar1 != 0) {
    sVar1 = ByteString::size((ByteString *)0x14d87a);
    if (sVar1 != 0) {
      sVar1 = ByteString::size((ByteString *)0x14d896);
      if (sVar1 != 0) {
        setP(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
        setG(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
        inBitLen = ByteString::long_val((ByteString *)in_RDI);
        setXBitLength(in_RDI,inBitLen);
        local_1 = true;
        goto LAB_0014d955;
      }
    }
  }
  local_1 = false;
LAB_0014d955:
  ByteString::~ByteString((ByteString *)0x14d95f);
  ByteString::~ByteString((ByteString *)0x14d969);
  ByteString::~ByteString((ByteString *)0x14d976);
  return local_1;
}

Assistant:

bool DHParameters::deserialise(ByteString& serialised)
{
	ByteString dP = ByteString::chainDeserialise(serialised);
	ByteString dG = ByteString::chainDeserialise(serialised);
	ByteString dLen = ByteString::chainDeserialise(serialised);

	if ((dP.size() == 0) ||
	    (dG.size() == 0) ||
	    (dLen.size() == 0))
	{
		return false;
	}

	setP(dP);
	setG(dG);
	setXBitLength(dLen.long_val());

	return true;
}